

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

object * gear_object_for_use(player *p,object *obj,wchar_t num,_Bool message,_Bool *none_left)

{
  wchar_t *pwVar1;
  byte *pbVar2;
  artifact *paVar3;
  player_upkeep *ppVar4;
  wchar_t amt;
  char cVar5;
  _Bool _Var6;
  int16_t iVar7;
  uint16_t uVar8;
  wchar_t wVar9;
  uint uVar10;
  object *poVar11;
  ushort uVar12;
  uint32_t mode;
  ulong uVar13;
  ulong uVar14;
  object **ppoVar15;
  char *fmt;
  object *first_remainder;
  char name [80];
  object *local_90;
  char local_88 [88];
  
  local_90 = (object *)0x0;
  cVar5 = gear_to_label(p,obj);
  paVar3 = obj->known->artifact;
  wVar9 = (wchar_t)obj->number;
  amt = num;
  if (wVar9 < num) {
    amt = wVar9;
  }
  if (num < wVar9) {
    poVar11 = object_split(obj,amt);
    iVar7 = object_weight_one(obj);
    pwVar1 = &p->upkeep->total_weight;
    *pwVar1 = *pwVar1 - iVar7 * amt;
    if (message) {
      uVar12 = (p->body).count;
      if (uVar12 == 0) {
        uVar14 = 0;
      }
      else {
        ppoVar15 = &((p->body).slots)->obj;
        uVar13 = 0;
        do {
          uVar14 = uVar13;
          if (*ppoVar15 == obj) break;
          uVar13 = uVar13 + 1;
          ppoVar15 = ppoVar15 + 4;
          uVar14 = (ulong)uVar12;
        } while (uVar12 != uVar13);
      }
      if ((((int)uVar14 < (int)(uint)uVar12) || (_Var6 = tval_can_have_charges(obj), _Var6)) ||
         ((_Var6 = tval_is_rod(obj), _Var6 || (0 < obj->timeout)))) {
        uVar10 = (uint)obj->number;
      }
      else {
        uVar8 = object_pack_total(p,obj,false,&local_90);
        uVar10 = (uint)uVar8;
        if (uVar8 < local_90->number) {
          __assert_fail("total >= first_remainder->number",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                        ,0x231,
                        "struct object *gear_object_for_use(struct player *, struct object *, int, _Bool, _Bool *)"
                       );
        }
        if (uVar8 == local_90->number) {
          local_90 = (object *)0x0;
        }
      }
      object_desc(local_88,0x50,obj,uVar10 << 0x10 | 0x443,p);
    }
  }
  else {
    if (message) {
      mode = 0x13;
      if (paVar3 == (artifact *)0x0) {
        uVar12 = (p->body).count;
        if (uVar12 == 0) {
          uVar14 = 0;
        }
        else {
          ppoVar15 = &((p->body).slots)->obj;
          uVar13 = 0;
          do {
            uVar14 = uVar13;
            if (*ppoVar15 == obj) break;
            uVar13 = uVar13 + 1;
            ppoVar15 = ppoVar15 + 4;
            uVar14 = (ulong)uVar12;
          } while (uVar12 != uVar13);
        }
        if (((((int)uVar14 < (int)(uint)uVar12) || (_Var6 = tval_can_have_charges(obj), _Var6)) ||
            (_Var6 = tval_is_rod(obj), _Var6)) || (0 < obj->timeout)) {
          wVar9 = (wchar_t)obj->number;
        }
        else {
          uVar8 = object_pack_total(p,obj,false,&local_90);
          wVar9 = (wchar_t)uVar8;
        }
        if (wVar9 < amt) {
          __assert_fail("total >= num",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                        ,0x250,
                        "struct object *gear_object_for_use(struct player *, struct object *, int, _Bool, _Bool *)"
                       );
        }
        uVar12 = (short)wVar9 - (short)amt;
        if ((uVar12 == 0) || (uVar12 <= local_90->number)) {
          local_90 = (object *)0x0;
        }
        mode = (uint)uVar12 << 0x10 | 0x443;
      }
      object_desc(local_88,0x50,obj,mode,p);
    }
    gear_excise_object(p,obj);
    *none_left = true;
    _Var6 = tracked_object_is(p->upkeep,obj);
    if (_Var6) {
      track_object(p->upkeep,(object *)0x0);
    }
    cmd_disable_repeat();
    poVar11 = obj;
  }
  ppVar4 = p->upkeep;
  ppVar4->update = ppVar4->update | 1;
  *(byte *)&ppVar4->notice = (byte)ppVar4->notice | 1;
  pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
  *pbVar2 = *pbVar2 | 6;
  if (message) {
    if (paVar3 == (artifact *)0x0) {
      if (local_90 == (object *)0x0) {
        fmt = "You have %s (%c).";
      }
      else {
        cVar5 = gear_to_label(p,local_90);
        fmt = "You have %s (1st %c).";
      }
    }
    else {
      fmt = "You no longer have the %s (%c).";
    }
    msg(fmt,local_88,(ulong)(uint)(int)cVar5);
  }
  return poVar11;
}

Assistant:

struct object *gear_object_for_use(struct player *p, struct object *obj,
	int num, bool message, bool *none_left)
{
	struct object *usable;
	struct object *first_remainder = NULL;
	char name[80];
	char label = gear_to_label(p, obj);
	bool artifact = (obj->known->artifact != NULL);

	/* Bounds check */
	num = MIN(num, obj->number);

	/* Split off a usable object if necessary */
	if (obj->number > num) {
		usable = object_split(obj, num);

		/* Change the weight */
		p->upkeep->total_weight -= num * object_weight_one(obj);

		if (message) {
			uint16_t total;

			/*
			 * Don't show aggregate total in pack if equipped or
			 * if the description could have a number of charges
			 * or recharging notice specific to the stack (not
			 * aggregating those quantities so there would be
			 * confusion if aggregating the count).
			 */
			if (object_is_equipped(p->body, obj)
					|| tval_can_have_charges(obj)
					|| tval_is_rod(obj)
					|| obj->timeout > 0) {
				total = obj->number;
			} else {
				total = object_pack_total(p, obj, false,
					&first_remainder);
				assert(total >= first_remainder->number);
				if (total == first_remainder->number) {
					first_remainder = NULL;
				}
			}
			object_desc(name, sizeof(name), obj,
				ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
				(total << 16), p);
		}
	} else {
		if (message) {
			if (artifact) {
				object_desc(name, sizeof(name), obj,
					ODESC_FULL | ODESC_SINGULAR, p);
			} else {
				uint16_t total;

				/*
				 * Use same logic as above for showing an
				 * aggregate total.
				 */
				if (object_is_equipped(p->body, obj)
						|| tval_can_have_charges(obj)
						|| tval_is_rod(obj)
						|| obj->timeout > 0) {
					total = obj->number;
				} else {
					total = object_pack_total(p, obj,
						false, &first_remainder);
				}

				assert(total >= num);
				total -= num;
				if (!total || total <= first_remainder->number) {
					first_remainder = NULL;
				}
				object_desc(name, sizeof(name), obj,
					ODESC_PREFIX | ODESC_FULL |
					ODESC_ALTNUM | (total << 16), p);
			}
		}

		/* We're using the entire stack */
		usable = obj;
		gear_excise_object(p, usable);
		*none_left = true;

		/* Stop tracking item */
		if (tracked_object_is(p->upkeep, obj))
			track_object(p->upkeep, NULL);

		/* Inventory has changed, so disable repeat command */
		cmd_disable_repeat();
	}

	/* Housekeeping */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->notice |= (PN_COMBINE);
	p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	/* Print a message if desired */
	if (message) {
		if (artifact) {
			msg("You no longer have the %s (%c).", name, label);
		} else if (first_remainder) {
			label = gear_to_label(p, first_remainder);
			msg("You have %s (1st %c).", name, label);
		} else {
			msg("You have %s (%c).", name, label);
		}
	}

	return usable;
}